

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::JoinCondition::CreateExpression(JoinCondition *this,JoinCondition *cond)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> in_RAX;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_18;
  
  local_18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)
       (_Head_base<0UL,_duckdb::Expression_*,_false>)in_RAX._M_head_impl;
  make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)&local_18,&cond->comparison,&cond->left,&cond->right);
  (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       local_18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> JoinCondition::CreateExpression(JoinCondition cond) {
	auto bound_comparison =
	    make_uniq<BoundComparisonExpression>(cond.comparison, std::move(cond.left), std::move(cond.right));
	return std::move(bound_comparison);
}